

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

bool __thiscall
Clasp::Solver::Dirty::add<Clasp::ClauseHead>
          (Dirty *this,ClauseHead **list,uintp other,Constraint *c)

{
  ClauseHead *pCVar1;
  
  pCVar1 = *list;
  *list = (ClauseHead *)((ulong)pCVar1 | 1);
  if (this->last != c) {
    this->last = c;
    std::__detail::
    _Insert_base<Clasp::Constraint_*,_Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>,_std::__detail::_Identity,_std::equal_to<Clasp::Constraint_*>,_std::hash<Clasp::Constraint_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::insert((_Insert_base<Clasp::Constraint_*,_Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>,_std::__detail::_Identity,_std::equal_to<Clasp::Constraint_*>,_std::hash<Clasp::Constraint_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)&this->cons,&this->last);
  }
  return (((uint)pCVar1 | (uint)other) & 1) == 0;
}

Assistant:

bool add(T*& list, uintp other, Constraint* c) {
		other |= reinterpret_cast<uintp>(list);
		list = reinterpret_cast<T*>( set_bit(reinterpret_cast<uintp>(list), 0) );
		if (c != last) { cons.insert(last = c); }
		return !test_bit(other, 0);
	}